

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_hex_eq(char *a,char *b,size_t size_a,size_t size_b,char *testcase,int line)

{
  int iVar1;
  uint uVar2;
  void *__s;
  char *in_RCX;
  char *in_RDX;
  void *in_RSI;
  void *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  int i;
  char *mask;
  int shorter;
  int longer;
  int err;
  char *local_58;
  char *local_50;
  bool local_45;
  int local_44;
  
  test_counter = test_counter + 1;
  local_45 = true;
  if (in_RDX == in_RCX) {
    iVar1 = memcmp(in_RDI,in_RSI,(size_t)in_RDX);
    local_45 = iVar1 != 0;
  }
  uVar2 = (uint)local_45;
  if (uVar2 == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_R8);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_R8);
    printf("# Error on line %d\n");
    local_50 = in_RCX;
    if (in_RCX < in_RDX) {
      local_50 = in_RDX;
    }
    local_58 = in_RCX;
    if (in_RDX < in_RCX) {
      local_58 = in_RDX;
    }
    __s = malloc((long)(int)local_50);
    memset(__s,0,(long)(int)local_50);
    for (local_44 = 0; local_44 < (int)local_58; local_44 = local_44 + 1) {
      if (*(char *)((long)in_RDI + (long)local_44) != *(char *)((long)in_RSI + (long)local_44)) {
        *(undefined1 *)((long)__s + (long)local_44) = 1;
      }
    }
    printf("#\n");
    printf("# Expected:\n");
    hexdump(in_RCX,in_R8,CONCAT44(in_R9D,uVar2));
    printf("#\n");
    printf("# Observed:\n");
    hexdump(in_RCX,in_R8,CONCAT44(in_R9D,uVar2));
    free(__s);
    global_err = global_err + 1;
  }
  return uVar2;
}

Assistant:

int assert_hex_eq(const char *a, const char *b, size_t size_a, size_t size_b,
                  const char *testcase, int line)
{
    test_counter++;
    int err = (size_a != size_b) || memcmp(a, b, size_a);
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Error on line %d\n", line);
        //printf("# Expected '%s', but observed '%s' instead (line %d)\n", a, b, line);

        //create difference mask
        const int longer  = size_a > size_b ? size_a : size_b;
        const int shorter = size_a < size_b ? size_a : size_b;
        char *mask = (char*)malloc(longer);
        memset(mask, 0, longer);
        for(int i=0; i<shorter; ++i)
            if(a[i] != b[i])
                mask[i] = 1;

        printf("#\n");
        printf("# Expected:\n");
        hexdump(a, mask, size_a);
        printf("#\n");
        printf("# Observed:\n");
        hexdump(b, mask, size_b);
        free(mask);

        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}